

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall
cmState::SetCacheEntryProperty(cmState *this,string *key,string *propertyName,string *value)

{
  cmCacheManager *this_00;
  char *pcVar1;
  undefined1 local_38 [8];
  CacheIterator it;
  string *value_local;
  string *propertyName_local;
  string *key_local;
  cmState *this_local;
  
  this_00 = this->CacheManager;
  it.Position._M_node = (_Base_ptr)value;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  _local_38 = cmCacheManager::GetCacheIterator(this_00,pcVar1);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  cmCacheManager::CacheIterator::SetProperty((CacheIterator *)local_38,propertyName,pcVar1);
  return;
}

Assistant:

void cmState::SetCacheEntryProperty(std::string const& key,
                                    std::string const& propertyName,
                                    std::string const& value)
{
  cmCacheManager::CacheIterator it =
    this->CacheManager->GetCacheIterator(key.c_str());
  it.SetProperty(propertyName, value.c_str());
}